

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O1

bool __thiscall cmCustomCommandGenerator::HasOnlyEmptyCommandLines(cmCustomCommandGenerator *this)

{
  pointer pcVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  pcVar1 = (this->CommandLines).
           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->CommandLines).
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1;
  bVar9 = lVar3 == 0;
  if (!bVar9) {
    uVar2 = (lVar3 >> 3) * -0x5555555555555555;
    uVar4 = 0;
    do {
      lVar3 = *(long *)&pcVar1[uVar4].
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      lVar5 = (long)*(pointer *)
                     ((long)&pcVar1[uVar4].
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     + 8) - lVar3;
      bVar10 = lVar5 != 0;
      if (bVar10) {
        uVar6 = lVar5 >> 5;
        if (*(long *)(lVar3 + 8) == 0) {
          plVar7 = (long *)(lVar3 + 0x28);
          uVar8 = 0;
          do {
            if ((uVar6 + (uVar6 == 0)) - 1 == uVar8) goto LAB_0035a675;
            uVar8 = uVar8 + 1;
            lVar3 = *plVar7;
            plVar7 = plVar7 + 4;
          } while (lVar3 == 0);
          bVar10 = uVar8 < uVar6;
        }
        if (bVar10) {
          return bVar9;
        }
      }
LAB_0035a675:
      uVar4 = uVar4 + 1;
      bVar9 = uVar2 <= uVar4;
    } while (uVar4 != uVar2 + (uVar2 == 0));
  }
  return bVar9;
}

Assistant:

bool cmCustomCommandGenerator::HasOnlyEmptyCommandLines() const
{
  for (size_t i = 0; i < this->CommandLines.size(); ++i) {
    for (size_t j = 0; j < this->CommandLines[i].size(); ++j) {
      if (!this->CommandLines[i][j].empty()) {
        return false;
      }
    }
  }
  return true;
}